

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O1

parsed_pe * peparse::ParsePEFromBuffer(bounded_buffer *buffer)

{
  pointer prVar1;
  bounded_buffer *b;
  bool bVar2;
  parsed_pe *p;
  parsed_pe_internal *ppVar3;
  long *plVar4;
  undefined8 *puVar5;
  size_type *psVar6;
  _func_ios_base_ptr_ios_base_ptr *f;
  _func_ios_base_ptr_ios_base_ptr *f_00;
  _func_ios_base_ptr_ios_base_ptr *f_01;
  _func_ios_base_ptr_ios_base_ptr *f_02;
  _func_ios_base_ptr_ios_base_ptr *f_03;
  _func_ios_base_ptr_ios_base_ptr *f_04;
  _func_ios_base_ptr_ios_base_ptr *f_05;
  bounded_buffer *remaining;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60;
  bounded_buffer *local_40;
  vector<peparse::section,_std::allocator<peparse::section>_> local_38;
  
  p = (parsed_pe *)operator_new(0x270,(nothrow_t *)&std::nothrow);
  if (p == (parsed_pe *)0x0) {
    p = (parsed_pe *)0x0;
  }
  else {
    memset(p,0,0x270);
  }
  if (p == (parsed_pe *)0x0) {
    err = 1;
    std::__cxx11::string::_M_replace((ulong)&err_loc_abi_cxx11_,0,DAT_001287f0,0x121f96);
    to_string<unsigned_int>(&local_60,0x9be,f);
    plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,0x121009);
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    psVar6 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_80.field_2._M_allocated_capacity = *psVar6;
      local_80.field_2._8_8_ = plVar4[3];
    }
    else {
      local_80.field_2._M_allocated_capacity = *psVar6;
      local_80._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_80._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&err_loc_abi_cxx11_,(ulong)local_80._M_dataplus._M_p);
LAB_0011b2e9:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p == &local_80.field_2) goto LAB_0011b300;
  }
  else {
    p->fileBuffer = buffer;
    ppVar3 = (parsed_pe_internal *)operator_new(0xa8,(nothrow_t *)&std::nothrow);
    if (ppVar3 == (parsed_pe_internal *)0x0) {
      ppVar3 = (parsed_pe_internal *)0x0;
    }
    else {
      memset(ppVar3,0,0xa8);
    }
    p->internal = ppVar3;
    if (ppVar3 == (parsed_pe_internal *)0x0) {
      deleteBuffer(buffer);
      prVar1 = (p->peHeader).rich.Entries.
               super__Vector_base<peparse::rich_entry,_std::allocator<peparse::rich_entry>_>._M_impl
               .super__Vector_impl_data._M_start;
      if (prVar1 != (pointer)0x0) {
        operator_delete(prVar1,(long)(p->peHeader).rich.Entries.
                                     super__Vector_base<peparse::rich_entry,_std::allocator<peparse::rich_entry>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)prVar1);
      }
      operator_delete(p,0x270);
      err = 1;
      std::__cxx11::string::_M_replace((ulong)&err_loc_abi_cxx11_,0,DAT_001287f0,0x121f96);
      to_string<unsigned_int>(&local_60,0x9ca,f_00);
      puVar5 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,0x121009);
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      psVar6 = puVar5 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_80.field_2._M_allocated_capacity = *psVar6;
        local_80.field_2._8_8_ = puVar5[3];
      }
      else {
        local_80.field_2._M_allocated_capacity = *psVar6;
        local_80._M_dataplus._M_p = (pointer)*puVar5;
      }
      local_80._M_string_length = puVar5[1];
      *puVar5 = psVar6;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&err_loc_abi_cxx11_,(ulong)local_80._M_dataplus._M_p);
      goto LAB_0011b2e9;
    }
    local_40 = (bounded_buffer *)0x0;
    bVar2 = getHeader(buffer,&p->peHeader,&local_40);
    b = local_40;
    if (!bVar2) {
LAB_0011af8a:
      deleteBuffer(b);
LAB_0011af8f:
      DestructParsedPE(p);
      return (parsed_pe *)0x0;
    }
    bVar2 = getSections(local_40,p->fileBuffer,&(p->peHeader).nt,&p->internal->secs);
    if (!bVar2) {
      deleteBuffer(b);
      DestructParsedPE(p);
      err = 3;
      std::__cxx11::string::_M_replace((ulong)&err_loc_abi_cxx11_,0,DAT_001287f0,0x121f96);
      to_string<unsigned_int>(&local_60,0x9db,f_01);
      puVar5 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,0x121009);
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      psVar6 = puVar5 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_80.field_2._M_allocated_capacity = *psVar6;
        local_80.field_2._8_8_ = puVar5[3];
      }
      else {
        local_80.field_2._M_allocated_capacity = *psVar6;
        local_80._M_dataplus._M_p = (pointer)*puVar5;
      }
      local_80._M_string_length = puVar5[1];
      *puVar5 = psVar6;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&err_loc_abi_cxx11_,(ulong)local_80._M_dataplus._M_p);
      goto LAB_0011b2e9;
    }
    ppVar3 = p->internal;
    std::vector<peparse::section,_std::allocator<peparse::section>_>::vector
              (&local_38,&ppVar3->secs);
    bVar2 = getResources(b,(bounded_buffer *)ppVar3,&local_38,&p->internal->rsrcs);
    std::vector<peparse::section,_std::allocator<peparse::section>_>::~vector(&local_38);
    if (!bVar2) {
      deleteBuffer(b);
      DestructParsedPE(p);
      err = 4;
      std::__cxx11::string::_M_replace((ulong)&err_loc_abi_cxx11_,0,DAT_001287f0,0x121f96);
      to_string<unsigned_int>(&local_60,0x9e2,f_02);
      puVar5 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,0x121009);
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      psVar6 = puVar5 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_80.field_2._M_allocated_capacity = *psVar6;
        local_80.field_2._8_8_ = puVar5[3];
      }
      else {
        local_80.field_2._M_allocated_capacity = *psVar6;
        local_80._M_dataplus._M_p = (pointer)*puVar5;
      }
      local_80._M_string_length = puVar5[1];
      *puVar5 = psVar6;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&err_loc_abi_cxx11_,(ulong)local_80._M_dataplus._M_p);
      goto LAB_0011b2e9;
    }
    bVar2 = getExports(p);
    if (!bVar2) {
      deleteBuffer(b);
      DestructParsedPE(p);
      err = 9;
      std::__cxx11::string::_M_replace((ulong)&err_loc_abi_cxx11_,0,DAT_001287f0,0x121f96);
      to_string<unsigned_int>(&local_60,0x9ea,f_03);
      puVar5 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,0x121009);
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      psVar6 = puVar5 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_80.field_2._M_allocated_capacity = *psVar6;
        local_80.field_2._8_8_ = puVar5[3];
      }
      else {
        local_80.field_2._M_allocated_capacity = *psVar6;
        local_80._M_dataplus._M_p = (pointer)*puVar5;
      }
      local_80._M_string_length = puVar5[1];
      *puVar5 = psVar6;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&err_loc_abi_cxx11_,(ulong)local_80._M_dataplus._M_p);
      goto LAB_0011b2e9;
    }
    bVar2 = getRelocations(p);
    if (bVar2) {
      bVar2 = getDebugDir(p);
      if (bVar2) {
        bVar2 = getImports(p);
        if (bVar2) {
          bVar2 = getSymbolTable(p);
          deleteBuffer(b);
          if (bVar2) {
            return p;
          }
          goto LAB_0011af8f;
        }
        goto LAB_0011af8a;
      }
      deleteBuffer(b);
      DestructParsedPE(p);
      err = 9;
      std::__cxx11::string::assign((char *)&err_loc_abi_cxx11_);
      to_string<unsigned_int>(&local_60,0x9f9,f_05);
      std::operator+(&local_80,":",&local_60);
      std::__cxx11::string::_M_append((char *)&err_loc_abi_cxx11_,(ulong)local_80._M_dataplus._M_p);
    }
    else {
      deleteBuffer(b);
      DestructParsedPE(p);
      err = 9;
      std::__cxx11::string::assign((char *)&err_loc_abi_cxx11_);
      to_string<unsigned_int>(&local_60,0x9f2,f_04);
      std::operator+(&local_80,":",&local_60);
      std::__cxx11::string::_M_append((char *)&err_loc_abi_cxx11_,(ulong)local_80._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p == &local_80.field_2) goto LAB_0011b300;
  }
  operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
LAB_0011b300:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return (parsed_pe *)0x0;
}

Assistant:

parsed_pe *ParsePEFromBuffer(bounded_buffer *buffer) {
  // First, create a new parsed_pe structure
  // We pass std::nothrow parameter to new so in case of failure it returns
  // nullptr instead of throwing exception std::bad_alloc.
  parsed_pe *p = new (std::nothrow) parsed_pe();

  if (p == nullptr) {
    PE_ERR(PEERR_MEM);
    return nullptr;
  }

  // Make a new buffer object to hold just our file data
  p->fileBuffer = buffer;

  p->internal = new (std::nothrow) parsed_pe_internal();

  if (p->internal == nullptr) {
    deleteBuffer(p->fileBuffer);
    delete p;
    PE_ERR(PEERR_MEM);
    return nullptr;
  }

  // get header information
  bounded_buffer *remaining = nullptr;
  if (!getHeader(p->fileBuffer, p->peHeader, remaining)) {
    deleteBuffer(remaining);
    DestructParsedPE(p);
    // err is set by getHeader
    return nullptr;
  }

  bounded_buffer *file = p->fileBuffer;
  if (!getSections(remaining, file, p->peHeader.nt, p->internal->secs)) {
    deleteBuffer(remaining);
    DestructParsedPE(p);
    PE_ERR(PEERR_SECT);
    return nullptr;
  }

  if (!getResources(remaining, file, p->internal->secs, p->internal->rsrcs)) {
    deleteBuffer(remaining);
    DestructParsedPE(p);
    PE_ERR(PEERR_RESC);
    return nullptr;
  }

  // Get exports
  if (!getExports(p)) {
    deleteBuffer(remaining);
    DestructParsedPE(p);
    PE_ERR(PEERR_MAGIC);
    return nullptr;
  }

  // Get relocations, if exist
  if (!getRelocations(p)) {
    deleteBuffer(remaining);
    DestructParsedPE(p);
    PE_ERR(PEERR_MAGIC);
    return nullptr;
  }

  if (!getDebugDir(p)) {
    deleteBuffer(remaining);
    DestructParsedPE(p);
    PE_ERR(PEERR_MAGIC);
    return nullptr;
  }

  // Get imports
  if (!getImports(p)) {
    deleteBuffer(remaining);
    DestructParsedPE(p);
    return nullptr;
  }

  // Get symbol table
  if (!getSymbolTable(p)) {
    deleteBuffer(remaining);
    DestructParsedPE(p);
    return nullptr;
  }

  deleteBuffer(remaining);

  return p;
}